

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

Sfm_Ntk_t * Abc_NtkExtractMfs(Abc_Ntk_t *pNtk,int nFirstFixed)

{
  char *pSop;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wec_t *p;
  Vec_Str_t *vFixed_00;
  Vec_Wrd_t *p_00;
  Abc_Obj_t *pAVar4;
  word Entry;
  Vec_Int_t *pVVar5;
  Abc_Obj_t *pAVar6;
  Sfm_Ntk_t *pSVar7;
  Vec_Ptr_t *local_70;
  word uTruth;
  int local_58;
  int nObjs;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Int_t *vArray;
  Vec_Wrd_t *vTruths;
  Vec_Str_t *vFixed;
  Vec_Wec_t *vFanins;
  Vec_Ptr_t *vNodes;
  int nFirstFixed_local;
  Abc_Ntk_t *pNtk_local;
  
  if (nFirstFixed == 0) {
    local_70 = Abc_NtkAssignIDs(pNtk);
  }
  else {
    local_70 = Abc_NtkAssignIDs2(pNtk);
  }
  iVar1 = Abc_NtkCiNum(pNtk);
  iVar2 = Vec_PtrSize(local_70);
  iVar3 = Abc_NtkCoNum(pNtk);
  iVar3 = iVar1 + iVar2 + iVar3;
  p = Vec_WecStart(iVar3);
  vFixed_00 = Vec_StrStart(iVar3);
  p_00 = Vec_WrdStart(iVar3);
  for (nObjs = 0; iVar1 = Vec_PtrSize(local_70), nObjs < iVar1; nObjs = nObjs + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(local_70,nObjs);
    pSop = (char *)(pAVar4->field_5).pData;
    iVar1 = Abc_ObjFaninNum(pAVar4);
    Entry = Abc_SopToTruth(pSop,iVar1);
    Vec_WrdWriteEntry(p_00,(pAVar4->field_6).iTemp,Entry);
    if ((Entry != 0) && (Entry != 0xffffffffffffffff)) {
      pVVar5 = Vec_WecEntry(p,(pAVar4->field_6).iTemp);
      iVar1 = Abc_ObjFaninNum(pAVar4);
      Vec_IntGrow(pVVar5,iVar1);
      for (local_58 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_58 < iVar1; local_58 = local_58 + 1)
      {
        pAVar6 = Abc_ObjFanin(pAVar4,local_58);
        Vec_IntPush(pVVar5,(pAVar6->field_6).iTemp);
      }
    }
  }
  for (nObjs = 0; iVar1 = Abc_NtkCoNum(pNtk), nObjs < iVar1; nObjs = nObjs + 1) {
    pAVar4 = Abc_NtkCo(pNtk,nObjs);
    pVVar5 = Vec_WecEntry(p,(pAVar4->field_6).iTemp);
    iVar1 = Abc_ObjFaninNum(pAVar4);
    Vec_IntGrow(pVVar5,iVar1);
    for (local_58 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_58 < iVar1; local_58 = local_58 + 1) {
      pAVar6 = Abc_ObjFanin(pAVar4,local_58);
      Vec_IntPush(pVVar5,(pAVar6->field_6).iTemp);
    }
  }
  Vec_PtrFree(local_70);
  for (nObjs = Abc_NtkCiNum(pNtk); iVar1 = Abc_NtkCiNum(pNtk), nObjs < iVar1 + nFirstFixed;
      nObjs = nObjs + 1) {
    Vec_StrWriteEntry(vFixed_00,nObjs,'\x01');
  }
  if ((-1 < nFirstFixed) && (iVar1 = Abc_NtkNodeNum(pNtk), nFirstFixed < iVar1)) {
    iVar1 = Abc_NtkCiNum(pNtk);
    iVar2 = Abc_NtkCoNum(pNtk);
    pSVar7 = Sfm_NtkConstruct(p,iVar1,iVar2,vFixed_00,(Vec_Str_t *)0x0,p_00);
    return pSVar7;
  }
  __assert_fail("nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                ,0x82,"Sfm_Ntk_t *Abc_NtkExtractMfs(Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs( Abc_Ntk_t * pNtk, int nFirstFixed )
{
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs;
    vNodes  = nFirstFixed ? Abc_NtkAssignIDs2(pNtk) : Abc_NtkAssignIDs(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
        Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
        if ( uTruth == 0 || ~uTruth == 0 )
            continue;
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    for ( i = Abc_NtkCiNum(pNtk); i < Abc_NtkCiNum(pNtk) + nFirstFixed; i++ )
        Vec_StrWriteEntry( vFixed, i, (char)1 );
    // update fixed
    assert( nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk) );
//    for ( i = Abc_NtkCiNum(pNtk); i + Abc_NtkCoNum(pNtk) < Abc_NtkObjNum(pNtk); i++ )
//        if ( rand() % 10 == 0 )
//            Vec_StrWriteEntry( vFixed, i, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths );
}